

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsImport.cpp
# Opt level: O0

int __thiscall
gdscpp::fetch_boundary_bounding_box(gdscpp *this,gdsBOUNDARY *target_boundary,int *destination)

{
  bool bVar1;
  reference pvVar2;
  reference piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  iterator y_iter;
  iterator x_iter;
  int bounding_box [4];
  int *destination_local;
  gdsBOUNDARY *target_boundary_local;
  gdscpp *this_local;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&target_boundary->xCor,0);
  x_iter._M_current._0_4_ = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&target_boundary->yCor,0);
  x_iter._M_current._4_4_ = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&target_boundary->xCor,0);
  bounding_box[0] = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&target_boundary->yCor,0);
  bounding_box[1] = *pvVar2;
  y_iter = std::vector<int,_std::allocator<int>_>::begin(&target_boundary->xCor);
  local_48._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&target_boundary->yCor)
  ;
  while( true ) {
    local_50._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&target_boundary->xCor)
    ;
    bVar1 = __gnu_cxx::operator!=(&y_iter,&local_50);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&y_iter);
    if (*piVar3 < (value_type)x_iter._M_current) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&y_iter);
      x_iter._M_current._0_4_ = *piVar3;
    }
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&y_iter);
    if (bounding_box[0] < *piVar3) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&y_iter);
      bounding_box[0] = *piVar3;
    }
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_48);
    if (*piVar3 < x_iter._M_current._4_4_) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_48);
      x_iter._M_current._4_4_ = *piVar3;
    }
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_48);
    if (bounding_box[1] < *piVar3) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_48);
      bounding_box[1] = *piVar3;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&y_iter,0);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_48,0);
  }
  *destination = (value_type)x_iter._M_current;
  destination[1] = x_iter._M_current._4_4_;
  destination[2] = bounding_box[0];
  destination[3] = bounding_box[1];
  return 0;
}

Assistant:

int gdscpp::fetch_boundary_bounding_box(gdsBOUNDARY target_boundary,
                                        int *destination)
{
  // Must start as a point in the geometry
  int bounding_box[4] = {target_boundary.xCor[0], target_boundary.yCor[0],
                         target_boundary.xCor[0], target_boundary.yCor[0]};
  auto x_iter = target_boundary.xCor.begin();
  auto y_iter = target_boundary.yCor.begin();
  while (x_iter != target_boundary.xCor.end()) {
    if (*x_iter < bounding_box[0])
      bounding_box[0] = *x_iter; // new minimum
    if (*x_iter > bounding_box[2])
      bounding_box[2] = *x_iter; // new maximum
    if (*y_iter < bounding_box[1])
      bounding_box[1] = *y_iter;
    if (*y_iter > bounding_box[3])
      bounding_box[3] = *y_iter;
    x_iter++;
    y_iter++;
  }
  destination[0] = bounding_box[0];
  destination[1] = bounding_box[1];
  destination[2] = bounding_box[2];
  destination[3] = bounding_box[3];
  return EXIT_SUCCESS;
}